

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O1

void __thiscall duckdb::TaskScheduler::RelaunchThreadsInternal(TaskScheduler *this,int32_t n)

{
  vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_true>
  *this_00;
  _Head_base<0UL,_std::thread_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  DBConfig *pDVar4;
  unsigned_long uVar5;
  reference this_01;
  type paVar6;
  pointer pCVar7;
  long lVar8;
  reference this_02;
  pointer this_03;
  thread *this_04;
  __sighandler_t __handler;
  pointer *__ptr;
  size_type __n;
  pointer __pos;
  ulong uVar9;
  unsigned_long val;
  size_type __n_00;
  templated_unique_single_t thread_wrapper;
  unique_ptr<std::thread,_std::default_delete<std::thread>,_true> worker_thread;
  unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true> marker;
  _Head_base<0UL,_duckdb::SchedulerThread_*,_false> local_58;
  _Head_base<0UL,_std::thread_*,_false> local_50;
  _Head_base<0UL,_std::atomic<bool>_*,_false> local_48;
  DBConfig *local_40;
  _Head_base<0UL,_std::atomic<bool>_*,_false> local_38;
  
  pDVar4 = DBConfig::GetConfig(this->db);
  uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert(n);
  this_00 = &this->threads;
  uVar9 = (long)(this->threads).
                super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->threads).
                super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar9 == uVar5) {
    iVar3 = NumericCastImpl<int,_unsigned_long,_false>::Convert
                      (uVar9 + (pDVar4->options).external_threads);
    LOCK();
    (this->current_thread_count).super___atomic_base<int>._M_i = iVar3;
    UNLOCK();
  }
  else {
    local_40 = pDVar4;
    if (uVar5 < uVar9) {
      if ((this->threads).
          super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (this->threads).
          super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        val = 0;
      }
      else {
        __n = 0;
        do {
          this_01 = vector<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_true>
                    ::operator[](&this->markers,__n);
          paVar6 = unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>::
                   operator*(this_01);
          LOCK();
          (paVar6->_M_base)._M_i = false;
          UNLOCK();
          __n = __n + 1;
          val = (long)(this->threads).
                      super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->threads).
                      super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3;
        } while (__n < val);
      }
      pCVar7 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
               ::operator->(&this->queue);
      lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
      duckdb_moodycamel::LightweightSemaphore::signal(&pCVar7->semaphore,(int)lVar8,__handler);
      __pos = (this->threads).
              super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      if ((this->threads).
          super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != __pos) {
        __n_00 = 0;
        do {
          this_02 = vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_true>
                    ::operator[](this_00,__n_00);
          this_03 = unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>
                    ::operator->(this_02);
          unique_ptr<std::thread,_std::default_delete<std::thread>,_true>::operator->
                    (&this_03->internal_thread);
          ::std::thread::join();
          __n_00 = __n_00 + 1;
          __pos = (this->threads).
                  super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        } while (__n_00 < (ulong)((long)(this->threads).
                                        super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)__pos >>
                                 3));
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
      ::_M_erase_at_end(&this_00->
                         super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                        ,__pos);
      ::std::
      vector<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
      ::clear(&(this->markers).
               super_vector<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
             );
    }
    uVar9 = (long)(this->threads).
                  super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->threads).
                  super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
    lVar8 = uVar5 - uVar9;
    if (uVar9 <= uVar5 && lVar8 != 0) {
      do {
        local_48._M_head_impl = (atomic<bool> *)operator_new(1);
        ((local_48._M_head_impl)->_M_base)._M_i = true;
        local_50._M_head_impl = (thread *)0x0;
        local_58._M_head_impl = (SchedulerThread *)this;
        local_38._M_head_impl = local_48._M_head_impl;
        this_04 = (thread *)operator_new(8);
        ::std::thread::
        thread<void(&)(duckdb::TaskScheduler*,std::atomic<bool>*),duckdb::TaskScheduler*,std::atomic<bool>*,void>
                  (this_04,ThreadExecuteTasks,(TaskScheduler **)&local_58,&local_38._M_head_impl);
        ::std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
                  ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)&local_50,
                   this_04);
        local_58._M_head_impl = (SchedulerThread *)operator_new(8);
        _Var1._M_head_impl = local_50._M_head_impl;
        local_50._M_head_impl = (thread *)0x0;
        ((local_58._M_head_impl)->internal_thread).
        super_unique_ptr<std::thread,_std::default_delete<std::thread>_>._M_t.
        super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
        super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_> =
             (_Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>)_Var1._M_head_impl;
        ::std::
        vector<duckdb::unique_ptr<duckdb::SchedulerThread,std::default_delete<duckdb::SchedulerThread>,true>,std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,std::default_delete<duckdb::SchedulerThread>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::SchedulerThread,std::default_delete<duckdb::SchedulerThread>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::SchedulerThread,std::default_delete<duckdb::SchedulerThread>,true>,std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,std::default_delete<duckdb::SchedulerThread>,true>>>
                    *)this_00,
                   (unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>
                    *)&local_58);
        ::std::
        vector<duckdb::unique_ptr<std::atomic<bool>,std::default_delete<std::atomic<bool>>,true>,std::allocator<duckdb::unique_ptr<std::atomic<bool>,std::default_delete<std::atomic<bool>>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<std::atomic<bool>,std::default_delete<std::atomic<bool>>,true>>
                  ((vector<duckdb::unique_ptr<std::atomic<bool>,std::default_delete<std::atomic<bool>>,true>,std::allocator<duckdb::unique_ptr<std::atomic<bool>,std::default_delete<std::atomic<bool>>,true>>>
                    *)&this->markers,
                   (unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true> *)
                   &local_48);
        if (local_58._M_head_impl != (SchedulerThread *)0x0) {
          ::std::default_delete<duckdb::SchedulerThread>::operator()
                    ((default_delete<duckdb::SchedulerThread> *)&local_58,local_58._M_head_impl);
        }
        if (local_50._M_head_impl != (thread *)0x0) {
          if (((local_50._M_head_impl)->_M_id)._M_thread != 0) {
            ::std::terminate();
          }
          operator_delete(local_50._M_head_impl);
        }
        if (local_48._M_head_impl != (atomic<bool> *)0x0) {
          operator_delete(local_48._M_head_impl);
        }
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    iVar3 = NumericCastImpl<int,_unsigned_long,_false>::Convert
                      (((long)(this->threads).
                              super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->threads).
                              super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) +
                       (local_40->options).external_threads);
    LOCK();
    (this->current_thread_count).super___atomic_base<int>._M_i = iVar3;
    UNLOCK();
    bVar2 = Allocator::SupportsFlush();
    if (bVar2) {
      Allocator::FlushAll();
    }
  }
  return;
}

Assistant:

void TaskScheduler::RelaunchThreadsInternal(int32_t n) {
#ifndef DUCKDB_NO_THREADS
	auto &config = DBConfig::GetConfig(db);
	auto new_thread_count = NumericCast<idx_t>(n);
	if (threads.size() == new_thread_count) {
		current_thread_count = NumericCast<int32_t>(threads.size() + config.options.external_threads);
		return;
	}
	if (threads.size() > new_thread_count) {
		// we are reducing the number of threads: clear all threads first
		for (idx_t i = 0; i < threads.size(); i++) {
			*markers[i] = false;
		}
		Signal(threads.size());
		// now join the threads to ensure they are fully stopped before erasing them
		for (idx_t i = 0; i < threads.size(); i++) {
			threads[i]->internal_thread->join();
		}
		// erase the threads/markers
		threads.clear();
		markers.clear();
	}
	if (threads.size() < new_thread_count) {
		// we are increasing the number of threads: launch them and run tasks on them
		idx_t create_new_threads = new_thread_count - threads.size();
		for (idx_t i = 0; i < create_new_threads; i++) {
			// launch a thread and assign it a cancellation marker
			auto marker = unique_ptr<atomic<bool>>(new atomic<bool>(true));
			unique_ptr<thread> worker_thread;
			try {
				worker_thread = make_uniq<thread>(ThreadExecuteTasks, this, marker.get());
			} catch (std::exception &ex) {
				// thread constructor failed - this can happen when the system has too many threads allocated
				// in this case we cannot allocate more threads - stop launching them
				break;
			}
			auto thread_wrapper = make_uniq<SchedulerThread>(std::move(worker_thread));

			threads.push_back(std::move(thread_wrapper));
			markers.push_back(std::move(marker));
		}
	}
	current_thread_count = NumericCast<int32_t>(threads.size() + config.options.external_threads);
	if (Allocator::SupportsFlush()) {
		Allocator::FlushAll();
	}
#endif
}